

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExemptionDatabase.cpp
# Opt level: O2

ssize_t __thiscall
RenX::ExemptionDatabase::write(ExemptionDatabase *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  fpos_t *__pos;
  DataBuffer buffer;
  char *local_28;
  
  __pos = (fpos_t *)CONCAT44(in_register_00000034,__fd);
  Jupiter::DataBuffer::DataBuffer((DataBuffer *)&stack0xffffffffffffffb8);
  fgetpos((FILE *)__buf,__pos);
  Jupiter::DataBuffer::push<unsigned_char>
            ((DataBuffer *)&stack0xffffffffffffffb8,(uchar *)(__pos + 1));
  local_28 = (char *)((long)__pos[1].__state / 1000000000);
  Jupiter::DataBuffer::push<long>
            ((DataBuffer *)&stack0xffffffffffffffb8,(long *)&stack0xffffffffffffffd8);
  local_28 = (char *)__pos[2].__pos;
  Jupiter::DataBuffer::push<long>
            ((DataBuffer *)&stack0xffffffffffffffb8,(long *)&stack0xffffffffffffffd8);
  Jupiter::DataBuffer::push<unsigned_long>
            ((DataBuffer *)&stack0xffffffffffffffb8,(unsigned_long *)&__pos[2].__state);
  Jupiter::DataBuffer::push<unsigned_int>
            ((DataBuffer *)&stack0xffffffffffffffb8,(uint *)(__pos + 3));
  Jupiter::DataBuffer::push<unsigned_char>
            ((DataBuffer *)&stack0xffffffffffffffb8,(uchar *)((long)&__pos[3].__pos + 4));
  _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
  push<char,std::char_traits<char>,std::allocator<char>>
            ((DataBuffer *)&stack0xffffffffffffffb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__pos[3].__state)
  ;
  Jupiter::DataBuffer::push_to((_IO_FILE *)&stack0xffffffffffffffb8);
  fgetpos((FILE *)__buf,(fpos_t *)&this->m_eof);
  sVar1 = Jupiter::DataBuffer::~DataBuffer((DataBuffer *)&stack0xffffffffffffffb8);
  return sVar1;
}

Assistant:

void RenX::ExemptionDatabase::write(RenX::ExemptionDatabase::Entry *entry, FILE *file) {
	Jupiter::DataBuffer buffer;
	fgetpos(file, &entry->pos);

	// push data from entry to buffer
	buffer.push(entry->flags);
	buffer.push(static_cast<int64_t>(std::chrono::duration_cast<std::chrono::seconds>(entry->timestamp.time_since_epoch()).count()));
	buffer.push(static_cast<int64_t>(entry->length.count()));
	buffer.push(entry->steamid);
	buffer.push(entry->ip);
	buffer.push(entry->prefix_length);
	buffer.push(entry->setter);

	// push buffer to file
	buffer.push_to(file);
	fgetpos(file, std::addressof(m_eof));
}